

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O2

void cave_known(player *p)

{
  _Bool _Var1;
  chunk_conflict *pcVar2;
  loc grid;
  loc grid_00;
  square *psVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar5 = 0;
  pcVar2 = cave;
  do {
    if (pcVar2->height <= lVar5) {
      return;
    }
    for (lVar7 = 0; lVar7 < pcVar2->width; lVar7 = lVar7 + 1) {
      grid = (loc)loc((int)lVar7,(int)lVar5);
      iVar6 = 0;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)ddgrid_ddd[lVar4]);
        _Var1 = square_isprojectable(cave,grid_00);
        if (_Var1) {
          _Var1 = square_isbright(cave,grid_00);
          if (_Var1) goto LAB_0012759b;
        }
        else {
LAB_0012759b:
          iVar6 = iVar6 + 1;
        }
      }
      if (iVar6 < 8) {
        psVar3 = square(cave,grid);
        p->cave->squares[lVar5][lVar7].feat = psVar3->feat;
      }
      pcVar2 = cave;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void cave_known(struct player *p)
{
	int y, x;
	for (y = 0; y < cave->height; y++) {
		for (x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			int d;
			int count = 0;

			/* Check around the grid */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc adj_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Don't count projectable or lava squares */
				if (!square_isprojectable(cave, adj_grid) ||
					square_isbright(cave, adj_grid))
					++count;
			}

			/* Internal walls not known */
			if (count < 8) {
				p->cave->squares[y][x].feat = square(cave, grid)->feat;
			}
		}
	}
}